

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.cpp
# Opt level: O0

int __thiscall zmq::ctx_t::unregister_endpoint(ctx_t *this,string *addr_,socket_base_t *socket_)

{
  iterator __position;
  bool bVar1;
  pointer ppVar2;
  int *piVar3;
  socket_base_t *in_RDX;
  bool bVar4;
  iterator it;
  scoped_lock_t locker;
  mutex_t *in_stack_ffffffffffffff78;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t>_>_>
  *in_stack_ffffffffffffff80;
  uint7 in_stack_ffffffffffffff88;
  _Self local_48 [3];
  _Self local_30 [2];
  socket_base_t *local_20;
  int local_4;
  
  local_20 = in_RDX;
  scoped_lock_t::scoped_lock_t((scoped_lock_t *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78)
  ;
  local_30[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t>_>_>
               *)in_stack_ffffffffffffff78,(key_type *)0x1d5f67);
  local_48[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t>_>_>
              *)in_stack_ffffffffffffff78);
  bVar1 = std::operator==(local_30,local_48);
  bVar4 = true;
  if (!bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t>_>
                           *)0x1d5fb4);
    bVar4 = (ppVar2->second).socket != local_20;
  }
  if (bVar4) {
    piVar3 = __errno_location();
    *piVar3 = 2;
    local_4 = -1;
  }
  else {
    __position._M_node._7_1_ = 0;
    __position._M_node._0_7_ = in_stack_ffffffffffffff88;
    std::
    map<std::__cxx11::string,zmq::endpoint_t,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,zmq::endpoint_t>>>
    ::erase_abi_cxx11_(in_stack_ffffffffffffff80,__position);
    local_4 = 0;
  }
  scoped_lock_t::~scoped_lock_t((scoped_lock_t *)0x1d6056);
  return local_4;
}

Assistant:

int zmq::ctx_t::unregister_endpoint (const std::string &addr_,
                                     const socket_base_t *const socket_)
{
    scoped_lock_t locker (_endpoints_sync);

    const endpoints_t::iterator it = _endpoints.find (addr_);
    if (it == _endpoints.end () || it->second.socket != socket_) {
        errno = ENOENT;
        return -1;
    }

    //  Remove endpoint.
    _endpoints.erase (it);

    return 0;
}